

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O3

void Ivy_GraphPrepare(Dec_Graph_t *pGraph,Ivy_Cut_t *pCut,Vec_Ptr_t *vFanins,char *pPerm)

{
  Dec_Node_t *pDVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  
  iVar7 = pGraph->nLeaves;
  if (iVar7 != pCut->nSize) {
    __assert_fail("Dec_GraphLeaveNum(pGraph) == pCut->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivySeq.c"
                  ,0x170,"void Ivy_GraphPrepare(Dec_Graph_t *, Ivy_Cut_t *, Vec_Ptr_t *, char *)");
  }
  if (vFanins->nSize == iVar7) {
    if (0 < iVar7) {
      lVar2 = 2;
      lVar4 = 0;
      do {
        if (vFanins->nSize <= lVar4) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pDVar1 = pGraph->pNodes;
        *(void **)((long)pDVar1 + lVar2 * 8 + -8) = vFanins->pArray[lVar4];
        (&pDVar1->eEdge0)[lVar2 * 2] =
             (Dec_Edge_t)
             ((uint)(&pDVar1->eEdge0)[lVar2 * 2] & 0x7ffffff | pCut->pArray[pPerm[lVar4]] << 0x1b);
        lVar4 = lVar4 + 1;
        iVar7 = pGraph->nLeaves;
        lVar2 = lVar2 + 3;
      } while (lVar4 < iVar7);
    }
    if (iVar7 < pGraph->nSize) {
      lVar4 = (long)iVar7;
      lVar2 = lVar4 * 0x18 + 0x10;
      do {
        pDVar1 = pGraph->pNodes;
        uVar5 = *(uint *)((long)pDVar1 + lVar2 + -0x10) >> 1 & 0x3fffffff;
        uVar8 = *(uint *)((long)pDVar1 + lVar2 + -0xc) >> 1 & 0x3fffffff;
        uVar6 = *(uint *)&pDVar1[uVar5].field_0x10 >> 0x1b;
        uVar9 = *(uint *)&pDVar1[uVar8].field_0x10 >> 0x1b;
        if (uVar6 < uVar9) {
          uVar9 = uVar6;
        }
        uVar3 = uVar9 << 0x1b;
        uVar6 = *(uint *)(&(pDVar1->eEdge0).field_0x0 + lVar2);
        *(uint *)(&(pDVar1->eEdge0).field_0x0 + lVar2) = uVar6 & 0x7ffffff | uVar3;
        uVar5 = ((*(uint *)&pDVar1[uVar5].field_0x10 >> 0x1b) - uVar9 & 0x1f) << 0x11;
        *(uint *)(&(pDVar1->eEdge0).field_0x0 + lVar2) = uVar6 & 0x7c1ffff | uVar3 | uVar5;
        *(uint *)(&(pDVar1->eEdge0).field_0x0 + lVar2) =
             uVar6 & 0x1ffff | uVar3 | uVar5 |
             ((*(uint *)&pDVar1[uVar8].field_0x10 >> 0x1b) - uVar9 & 0x1f) << 0x16;
        lVar4 = lVar4 + 1;
        lVar2 = lVar2 + 0x18;
      } while (lVar4 < pGraph->nSize);
    }
    return;
  }
  __assert_fail("Vec_PtrSize(vFanins) == pCut->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivySeq.c"
                ,0x171,"void Ivy_GraphPrepare(Dec_Graph_t *, Ivy_Cut_t *, Vec_Ptr_t *, char *)");
}

Assistant:

void Ivy_GraphPrepare( Dec_Graph_t * pGraph, Ivy_Cut_t * pCut, Vec_Ptr_t * vFanins, char * pPerm )
{
    Dec_Node_t * pNode, * pNode0, * pNode1;
    int i;
    assert( Dec_GraphLeaveNum(pGraph) == pCut->nSize );
    assert( Vec_PtrSize(vFanins) == pCut->nSize );
    // label the leaves with latch numbers
    Dec_GraphForEachLeaf( pGraph, pNode, i )
    {
        pNode->pFunc = Vec_PtrEntry( vFanins, i );
        pNode->nLat2 = Ivy_LeafLat( pCut->pArray[(int)pPerm[i]] );
    }
    // propagate latches through the nodes
    Dec_GraphForEachNode( pGraph, pNode, i )
    {
        // get the children of this node
        pNode0 = Dec_GraphNode( pGraph, pNode->eEdge0.Node );
        pNode1 = Dec_GraphNode( pGraph, pNode->eEdge1.Node );
        // distribute the latches
        pNode->nLat2 = IVY_MIN( pNode0->nLat2, pNode1->nLat2 );
        pNode->nLat0 = pNode0->nLat2 - pNode->nLat2;
        pNode->nLat1 = pNode1->nLat2 - pNode->nLat2;
    }
}